

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::SerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,uint8 *target)

{
  bool deterministic;
  size_t sVar1;
  uint8 *puVar2;
  void *in_RSI;
  EpsCopyOutputStream stream;
  EpsCopyOutputStream *in_stack_ffffffffffffffb0;
  uint8 *in_stack_ffffffffffffffb8;
  ExtensionSet *in_stack_ffffffffffffffc0;
  
  sVar1 = MessageSetByteSize((ExtensionSet *)in_stack_ffffffffffffffb0);
  deterministic = io::CodedOutputStream::IsDefaultSerializationDeterministic();
  io::EpsCopyOutputStream::EpsCopyOutputStream
            ((EpsCopyOutputStream *)&stack0xffffffffffffffb0,in_RSI,(int)sVar1,deterministic);
  puVar2 = InternalSerializeMessageSetWithCachedSizesToArray
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  return puVar2;
}

Assistant:

uint8* ExtensionSet::SerializeMessageSetWithCachedSizesToArray(
    uint8* target) const {
  io::EpsCopyOutputStream stream(
      target, MessageSetByteSize(),
      io::CodedOutputStream::IsDefaultSerializationDeterministic());
  return InternalSerializeMessageSetWithCachedSizesToArray(target, &stream);
}